

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  char cVar1;
  pointer pAVar2;
  int iVar3;
  long lVar4;
  pointer pAVar5;
  int iVar6;
  pointer pOVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  int k;
  bool *pbVar14;
  size_t sVar15;
  size_t arg_index;
  size_t local_68;
  char *local_60;
  pointer local_58;
  long local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  local_68 = 0;
  if (argc < 2) {
LAB_00135f54:
    pAVar5 = (this->arguments_).
             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->arguments_).
             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((pAVar5 != pAVar2) && (pAVar2[-1].handled_count == 0)) &&
       (local_68 < (ulong)(((long)pAVar2 - (long)pAVar5 >> 4) * -0x3333333333333333))) {
      lVar4 = local_68 * 0x50;
      sVar15 = local_68;
      do {
        Errorf(this,"expected %s argument.",
               *(undefined8 *)((long)&(pAVar5->name)._M_dataplus._M_p + lVar4));
        sVar15 = sVar15 + 1;
        pAVar5 = (this->arguments_).
                 super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x50;
      } while (sVar15 < (ulong)(((long)(this->arguments_).
                                       super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >>
                                4) * -0x3333333333333333));
    }
    return;
  }
  iVar6 = 1;
LAB_00135c3b:
  pcVar11 = argv[iVar6];
  if ((*pcVar11 == '-') && (cVar1 = pcVar11[1], cVar1 != '\0')) {
    if (cVar1 == '-') {
      pOVar7 = (this->options_).
               super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(this->options_).
                    super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar7;
      if (lVar4 != 0) {
        local_38 = (lVar4 >> 4) * -0x71c71c71c71c71c7;
        local_40 = pcVar11 + 2;
        local_38 = local_38 + (ulong)(local_38 == 0);
        local_50 = local_38 + -1;
        lVar12 = -1;
        iVar13 = 0;
        lVar4 = 0;
        local_58 = pOVar7;
        iVar9 = 0;
LAB_00135cd1:
        pbVar14 = &pOVar7[lVar4].has_argument;
        local_48 = lVar12;
        do {
          lVar12 = lVar4;
          if (*(size_type *)(pbVar14 + -0x38) != 0) {
            iVar3 = Match(local_40,(string *)(pbVar14 + -0x40),*pbVar14);
            if (iVar9 < iVar3) goto LAB_00135d2c;
            iVar13 = iVar13 + (uint)(iVar3 == iVar9 && 0 < iVar9);
          }
          pbVar14 = pbVar14 + 0x90;
          lVar4 = lVar12 + 1;
          if (local_38 == lVar12 + 1) {
            if (iVar13 < 2) {
              lVar12 = local_48;
              iVar3 = iVar9;
              if (iVar13 == 0) break;
              goto LAB_00135e71;
            }
            pcVar10 = "ambiguous option \'%s\'";
            goto LAB_00135eba;
          }
        } while( true );
      }
      pcVar10 = "unknown option \'%s\'";
LAB_00135eba:
      Errorf(this,pcVar10,pcVar11);
    }
    else {
      pcVar10 = pcVar11 + 1;
      lVar4 = 1;
      do {
        for (pOVar7 = (this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pOVar7 != (this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
          if ((pOVar7->short_name != '\0') && (cVar1 == pOVar7->short_name)) {
            if (pOVar7->has_argument == true) {
              if (((pcVar10[1] != '\0') || (iVar9 = iVar6 + 1, iVar9 == argc)) ||
                 (pcVar8 = argv[iVar9], *pcVar8 == '-')) {
                Errorf(this,"option \'-%c\' requires argument",(ulong)(uint)(int)cVar1);
                break;
              }
            }
            else {
              pcVar8 = (char *)0x0;
              iVar9 = iVar6;
            }
            local_60 = pcVar8;
            if ((pOVar7->callback).super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00135fd7;
            (*(pOVar7->callback)._M_invoker)((_Any_data *)&pOVar7->callback,&local_60);
            iVar6 = iVar9;
            goto LAB_00135df6;
          }
        }
        Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)*pcVar10);
LAB_00135df6:
        pcVar10 = pcVar11 + lVar4 + 1;
        lVar4 = lVar4 + 1;
        cVar1 = *pcVar10;
      } while (cVar1 != '\0');
    }
  }
  else {
    HandleArgument(this,&local_68,pcVar11);
  }
  goto LAB_00135d5a;
LAB_00135d2c:
  lVar4 = lVar12 + 1;
  iVar13 = 1;
  iVar9 = iVar3;
  if (local_50 == lVar12) goto LAB_00135e71;
  goto LAB_00135cd1;
LAB_00135e71:
  iVar13 = (int)lVar12;
  iVar9 = iVar6;
  if (local_58[iVar13].has_argument == true) {
    lVar4 = (long)iVar3;
    if ((pcVar11[lVar4 + 1] == '\0') || (pcVar11[lVar4 + 2] != '=')) {
      iVar9 = iVar6 + 1;
      if ((iVar9 == argc) || (pcVar11 = argv[iVar9], *pcVar11 == '-')) {
        Errorf(this,"option \'--%s\' requires argument",local_58[iVar13].long_name._M_dataplus._M_p)
        ;
        goto LAB_00135d5a;
      }
    }
    else {
      pcVar11 = pcVar11 + lVar4 + 3;
    }
  }
  else {
    pcVar11 = (char *)0x0;
  }
  iVar6 = iVar9;
  local_60 = pcVar11;
  if (local_58[iVar13].callback.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00135fd7:
    std::__throw_bad_function_call();
  }
  (*local_58[iVar13].callback._M_invoker)((_Any_data *)&local_58[iVar13].callback,&local_60);
LAB_00135d5a:
  iVar6 = iVar6 + 1;
  if (argc <= iVar6) goto LAB_00135f54;
  goto LAB_00135c3b;
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (arg[0] == '-') {
      if (arg[1] == '-') {
        // Long option.
        int best_index = -1;
        int best_length = 0;
        int best_count = 0;
        for (size_t j = 0; j < options_.size(); ++j) {
          const Option& option = options_[j];
          if (!option.long_name.empty()) {
            int match_length =
                Match(&arg[2], option.long_name, option.has_argument);
            if (match_length > best_length) {
              best_index = j;
              best_length = match_length;
              best_count = 1;
            } else if (match_length == best_length && best_length > 0) {
              best_count++;
            }
          }
        }

        if (best_count > 1) {
          Errorf("ambiguous option '%s'", arg);
          continue;
        } else if (best_count == 0) {
          Errorf("unknown option '%s'", arg);
          continue;
        }

        const Option& best_option = options_[best_index];
        const char* option_argument = nullptr;
        if (best_option.has_argument) {
          if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
              arg[best_length + 2] == '=') {  // +2 to skip "--".
            option_argument = &arg[best_length + 3];
          } else {
            if (i + 1 == argc || argv[i + 1][0] == '-') {
              Errorf("option '--%s' requires argument",
                     best_option.long_name.c_str());
              continue;
            }
            ++i;
            option_argument = argv[i];
          }
        }
        best_option.callback(option_argument);
      } else {
        // Short option.
        if (arg[1] == '\0') {
          // Just "-".
          HandleArgument(&arg_index, arg);
          continue;
        }

        // Allow short names to be combined, e.g. "-d -v" => "-dv".
        for (int k = 1; arg[k]; ++k) {
          bool matched = false;
          for (const Option& option : options_) {
            if (option.short_name && arg[k] == option.short_name) {
              const char* option_argument = nullptr;
              if (option.has_argument) {
                // A short option with a required argument cannot be followed
                // by other short options_.
                if (arg[k + 1] != '\0') {
                  Errorf("option '-%c' requires argument", option.short_name);
                  break;
                }

                if (i + 1 == argc || argv[i + 1][0] == '-') {
                  Errorf("option '-%c' requires argument", option.short_name);
                  break;
                }
                ++i;
                option_argument = argv[i];
              }
              option.callback(option_argument);
              matched = true;
              break;
            }
          }

          if (!matched) {
            Errorf("unknown option '-%c'", arg[k]);
            continue;
          }
        }
      }
    } else {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      Errorf("expected %s argument.", arguments_[i].name.c_str());
    }
  }
}